

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O1

UniquePtr<EC_GROUP> NewSecp160r1Group(void)

{
  _Head_base<0UL,_ec_group_st_*,_false> group_00;
  _Head_base<0UL,_ec_point_st_*,_false> generator;
  _Head_base<0UL,_bignum_st_*,_false> order;
  int iVar1;
  BIGNUM *cofactor;
  __uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  UniquePtr<EC_GROUP> group;
  UniquePtr<BIGNUM> y;
  UniquePtr<BIGNUM> x;
  UniquePtr<EC_POINT> g;
  UniquePtr<BIGNUM> n;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> a;
  UniquePtr<BIGNUM> p;
  _Head_base<0UL,_ec_group_st_*,_false> local_60;
  _Head_base<0UL,_bignum_st_*,_false> local_58;
  _Head_base<0UL,_bignum_st_*,_false> local_50;
  _Head_base<0UL,_ec_point_st_*,_false> local_48;
  _Head_base<0UL,_bignum_st_*,_false> local_40;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> local_30;
  _Head_base<0UL,_bignum_st_*,_false> local_28;
  
  local_60._M_head_impl = (ec_group_st *)0x0;
  BN_hex2bn((BIGNUM **)&local_60,"ffffffffffffffffffffffffffffffff7fffffff");
  local_28._M_head_impl = (bignum_st *)local_60._M_head_impl;
  local_60._M_head_impl = (ec_group_st *)0x0;
  BN_hex2bn((BIGNUM **)&local_60,"ffffffffffffffffffffffffffffffff7ffffffc");
  local_30._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (tuple<bignum_st_*,_bssl::internal::Deleter>)
       (tuple<bignum_st_*,_bssl::internal::Deleter>)local_60._M_head_impl;
  local_60._M_head_impl = (ec_group_st *)0x0;
  BN_hex2bn((BIGNUM **)&local_60,"1c97befc54bd7a8b65acf89f81d4d4adc565fa45");
  local_38._M_head_impl = (bignum_st *)local_60._M_head_impl;
  local_60._M_head_impl = (ec_group_st *)0x0;
  BN_hex2bn((BIGNUM **)&local_60,"4a96b5688ef573284664698968c38bb913cbfc82");
  local_50._M_head_impl = (bignum_st *)local_60._M_head_impl;
  local_60._M_head_impl = (ec_group_st *)0x0;
  BN_hex2bn((BIGNUM **)&local_60,"23a628553168947d59dcc912042351377ac5fb32");
  local_58._M_head_impl = (bignum_st *)local_60._M_head_impl;
  local_60._M_head_impl = (ec_group_st *)0x0;
  BN_hex2bn((BIGNUM **)&local_60,"0100000000000000000001f4c8f927aed3ca752257");
  local_40._M_head_impl = (bignum_st *)local_60._M_head_impl;
  if ((((ec_group_st *)local_28._M_head_impl == (ec_group_st *)0x0) ||
      ((_Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>)
       local_30._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl == (bignum_st *)0x0)) ||
     (((ec_group_st *)local_58._M_head_impl == (ec_group_st *)0x0 ||
      ((ec_group_st *)local_50._M_head_impl == (ec_group_st *)0x0 ||
      (ec_group_st *)local_38._M_head_impl == (ec_group_st *)0x0)) ||
      local_60._M_head_impl == (ec_group_st *)0x0)) {
    *(undefined8 *)
     in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = 0;
    goto LAB_0030245c;
  }
  local_60._M_head_impl =
       (ec_group_st *)
       EC_GROUP_new_curve_GFp
                 ((BIGNUM *)local_28._M_head_impl,
                  (BIGNUM *)
                  local_30._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                  (BIGNUM *)local_38._M_head_impl,(BN_CTX *)0x0);
  if (local_60._M_head_impl == (ec_group_st *)0x0) {
    *(undefined8 *)
     in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = 0;
  }
  else {
    local_48._M_head_impl = (ec_point_st *)EC_POINT_new((EC_GROUP *)local_60._M_head_impl);
    if (local_48._M_head_impl == (ec_point_st *)0x0) {
LAB_003024a7:
      *(undefined8 *)
       in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = 0;
    }
    else {
      iVar1 = EC_POINT_set_affine_coordinates_GFp
                        ((EC_GROUP *)local_60._M_head_impl,(EC_POINT *)local_48._M_head_impl,
                         (BIGNUM *)local_50._M_head_impl,(BIGNUM *)local_58._M_head_impl,
                         (BN_CTX *)0x0);
      order._M_head_impl = local_40._M_head_impl;
      generator._M_head_impl = local_48._M_head_impl;
      group_00._M_head_impl = local_60._M_head_impl;
      if (iVar1 == 0) goto LAB_003024a7;
      cofactor = BN_value_one();
      iVar1 = EC_GROUP_set_generator
                        ((EC_GROUP *)group_00._M_head_impl,(EC_POINT *)generator._M_head_impl,
                         (BIGNUM *)order._M_head_impl,cofactor);
      if (iVar1 == 0) goto LAB_003024a7;
      *(ec_group_st **)
       in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl = local_60._M_head_impl;
      local_60._M_head_impl = (ec_group_st *)0x0;
    }
    std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_48);
  }
  std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&local_60);
LAB_0030245c:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_40);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_58);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_30);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_28);
  return (__uniq_ptr_data<ec_group_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<ec_group_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<ec_group_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ec_group_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ec_group_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EC_GROUP> NewSecp160r1Group() {
  static const char kP[] = "ffffffffffffffffffffffffffffffff7fffffff";
  static const char kA[] = "ffffffffffffffffffffffffffffffff7ffffffc";
  static const char kB[] = "1c97befc54bd7a8b65acf89f81d4d4adc565fa45";
  static const char kX[] = "4a96b5688ef573284664698968c38bb913cbfc82";
  static const char kY[] = "23a628553168947d59dcc912042351377ac5fb32";
  static const char kN[] = "0100000000000000000001f4c8f927aed3ca752257";

  bssl::UniquePtr<BIGNUM> p = HexToBIGNUM(kP), a = HexToBIGNUM(kA),
                          b = HexToBIGNUM(kB), x = HexToBIGNUM(kX),
                          y = HexToBIGNUM(kY), n = HexToBIGNUM(kN);
  if (!p || !a || !b || !x || !y || !n) {
    return nullptr;
  }

  bssl::UniquePtr<EC_GROUP> group(
      EC_GROUP_new_curve_GFp(p.get(), a.get(), b.get(), nullptr));
  if (!group) {
    return nullptr;
  }
  bssl::UniquePtr<EC_POINT> g(EC_POINT_new(group.get()));
  if (!g ||
      !EC_POINT_set_affine_coordinates_GFp(group.get(), g.get(), x.get(),
                                           y.get(), nullptr) ||
      !EC_GROUP_set_generator(group.get(), g.get(), n.get(), BN_value_one())) {
    return nullptr;
  }
  return group;
}